

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

int __thiscall model::load_model(model *this,string *file_path)

{
  pointer pcVar1;
  FILE *__stream;
  unsigned_long uVar2;
  vector<float,_std::allocator<float>_> intercepts;
  vector<float,_std::allocator<float>_> params;
  char buff1 [512];
  char buff2 [1000000];
  
  __stream = fopen((file_path->_M_dataplus)._M_p,"r");
  pcVar1 = (file_path->_M_dataplus)._M_p;
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file %s to read!\n",pcVar1);
  }
  else {
    printf("Load model from %s\n",pcVar1);
    fgets(buff1,0x1ff,__stream);
    uVar2 = atol(buff1);
    this->num_features = uVar2;
    fgets(buff1,0x1ff,__stream);
    readFromSep<float>(&params,buff1,' ');
    this->alpha = *params.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
    this->beta = params.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[1];
    this->lambda1 =
         params.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start[2];
    this->lambda2 =
         params.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start[3];
    init_model(this);
    fgets(buff1,0x1ff,__stream);
    readFromSep<float>(&intercepts,buff1,' ');
    this->z_intercept =
         *intercepts.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start;
    this->n_intercept =
         intercepts.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_start[1];
    this->w_intercept =
         intercepts.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_start[2];
    fgets(buff2,999999,__stream);
    libsvm2sparse<float>
              ((vector<float,_std::allocator<float>_> *)&stack0xfffffffffff0bb50,buff2,
               this->num_features);
    std::vector<float,_std::allocator<float>_>::_M_move_assign
              (&this->z,(_Vector_base<float,_std::allocator<float>_> *)&stack0xfffffffffff0bb50);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&stack0xfffffffffff0bb50);
    fgets(buff2,999999,__stream);
    libsvm2sparse<float>
              ((vector<float,_std::allocator<float>_> *)&stack0xfffffffffff0bb50,buff2,
               this->num_features);
    std::vector<float,_std::allocator<float>_>::_M_move_assign
              (&this->n,(_Vector_base<float,_std::allocator<float>_> *)&stack0xfffffffffff0bb50);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&stack0xfffffffffff0bb50);
    fgets(buff2,999999,__stream);
    libsvm2sparse<float>
              ((vector<float,_std::allocator<float>_> *)&stack0xfffffffffff0bb50,buff2,
               this->num_features);
    std::vector<float,_std::allocator<float>_>::_M_move_assign
              (&this->w,(_Vector_base<float,_std::allocator<float>_> *)&stack0xfffffffffff0bb50);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&stack0xfffffffffff0bb50);
    fclose(__stream);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&intercepts.super__Vector_base<float,_std::allocator<float>_>);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&params.super__Vector_base<float,_std::allocator<float>_>);
  }
  return (uint)(__stream == (FILE *)0x0);
}

Assistant:

int model::load_model(string & file_path) {
    FILE * fin = fopen(file_path.c_str(), "r");
    if (!fin) {
        printf("Cannot open file %s to read!\n", file_path.c_str());
        return 1;
    }
    printf("Load model from %s\n", file_path.c_str());

    char buff1[BUFF_SIZE_SHORT];

    //load num_features
    fgets(buff1, BUFF_SIZE_SHORT - 1, fin);
    num_features = (unsigned long)atol(buff1);

    //load alpha, beta, lambda1, lambda2
    fgets(buff1, BUFF_SIZE_SHORT - 1, fin);
    vector<float> params = readFromSep<float>(buff1, ' ');
    alpha = params[0], beta = params[1], lambda1 = params[2], lambda2 = params[3];

    init_model();

    //loda z_intercept, n_intercept, w_intercept
    fgets(buff1, BUFF_SIZE_SHORT - 1, fin);
    vector<float> intercepts = readFromSep<float>(buff1, ' ');
    z_intercept = intercepts[0], n_intercept = intercepts[1], w_intercept = intercepts[2];

    char buff2[BUFF_SIZE_LONG];

    //load z
    fgets(buff2, BUFF_SIZE_LONG - 1, fin);
    z = libsvm2sparse<float>(buff2, num_features);

    //load n
    fgets(buff2, BUFF_SIZE_LONG - 1, fin);
    n = libsvm2sparse<float>(buff2, num_features);

    //load w
    fgets(buff2, BUFF_SIZE_LONG - 1, fin);
    w = libsvm2sparse<float>(buff2, num_features);

    fclose(fin);
    return 0;
}